

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcPrint.c
# Opt level: O2

void Abc_NtkPrintStrSupports(Abc_Ntk_t *pNtk,int fMatrix)

{
  uint uVar1;
  Vec_Ptr_t *pVVar2;
  Vec_Ptr_t *p;
  char *pcVar3;
  int iVar4;
  int iVar5;
  uint i;
  Abc_Obj_t *pObj;
  int local_34;
  
  local_34 = fMatrix;
  puts("Structural support info:");
  for (i = 0; (int)i < pNtk->vCos->nSize; i = i + 1) {
    pObj = Abc_NtkCo(pNtk,i);
    pVVar2 = Abc_NtkNodeSupport(pNtk,&pObj,1);
    p = Abc_NtkDfsNodes(pNtk,&pObj,1);
    uVar1 = Abc_NtkCountPis(pVVar2);
    pcVar3 = Abc_ObjName(pObj);
    printf("%5d  %20s :  Cone = %5d.  Supp = %5d. (PIs = %5d. FFs = %5d.)\n",(ulong)i,pcVar3,
           (ulong)(uint)p->nSize,(ulong)(uint)pVVar2->nSize,(ulong)uVar1,pVVar2->nSize - uVar1);
    Vec_PtrFree(p);
    Vec_PtrFree(pVVar2);
  }
  if (local_34 != 0) {
    for (iVar4 = 0; iVar4 < pNtk->vCis->nSize; iVar4 = iVar4 + 1) {
      pObj = Abc_NtkCi(pNtk,iVar4);
      pObj->field_0x14 = pObj->field_0x14 & 0xef;
    }
    puts("Actual support info:");
    for (iVar4 = 0; iVar4 < pNtk->vCos->nSize; iVar4 = iVar4 + 1) {
      pObj = Abc_NtkCo(pNtk,iVar4);
      pVVar2 = Abc_NtkNodeSupport(pNtk,&pObj,1);
      for (iVar5 = 0; iVar5 < pVVar2->nSize; iVar5 = iVar5 + 1) {
        pObj = (Abc_Obj_t *)Vec_PtrEntry(pVVar2,iVar5);
        pObj->field_0x14 = pObj->field_0x14 | 0x10;
      }
      Vec_PtrFree(pVVar2);
      for (iVar5 = 0; iVar5 < pNtk->vCis->nSize; iVar5 = iVar5 + 1) {
        pObj = Abc_NtkCi(pNtk,iVar5);
        printf("%d",(ulong)(*(uint *)&pObj->field_0x14 >> 4 & 1));
      }
      putchar(10);
      for (iVar5 = 0; iVar5 < pNtk->vCis->nSize; iVar5 = iVar5 + 1) {
        pObj = Abc_NtkCi(pNtk,iVar5);
        pObj->field_0x14 = pObj->field_0x14 & 0xef;
      }
    }
  }
  Abc_NtkCleanMarkA(pNtk);
  return;
}

Assistant:

void Abc_NtkPrintStrSupports( Abc_Ntk_t * pNtk, int fMatrix )
{
    Vec_Ptr_t * vSupp, * vNodes;
    Abc_Obj_t * pObj;
    int i, k, nPis;
    printf( "Structural support info:\n" );
    Abc_NtkForEachCo( pNtk, pObj, i )
    {
        vSupp  = Abc_NtkNodeSupport( pNtk, &pObj, 1 );
        vNodes = Abc_NtkDfsNodes( pNtk, &pObj, 1 );
        nPis   = Abc_NtkCountPis( vSupp );
        printf( "%5d  %20s :  Cone = %5d.  Supp = %5d. (PIs = %5d. FFs = %5d.)\n",
            i, Abc_ObjName(pObj), vNodes->nSize, vSupp->nSize, nPis, vSupp->nSize - nPis );
        Vec_PtrFree( vNodes );
        Vec_PtrFree( vSupp );
    }
    if ( !fMatrix )
    {
        Abc_NtkCleanMarkA( pNtk );
        return;
    }

    Abc_NtkForEachCi( pNtk, pObj, k )
        pObj->fMarkA = 0;

    printf( "Actual support info:\n" );
    Abc_NtkForEachCo( pNtk, pObj, i )
    {
        vSupp  = Abc_NtkNodeSupport( pNtk, &pObj, 1 );
        Vec_PtrForEachEntry( Abc_Obj_t *, vSupp, pObj, k )
            pObj->fMarkA = 1;
        Vec_PtrFree( vSupp );

        Abc_NtkForEachCi( pNtk, pObj, k )
            printf( "%d", pObj->fMarkA );
        printf( "\n" );

        Abc_NtkForEachCi( pNtk, pObj, k )
            pObj->fMarkA = 0;
    }
    Abc_NtkCleanMarkA( pNtk );
}